

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

size_t sum_dividers<unsigned_int,std::vector<libdivide::divider<unsigned_int,(libdivide::Branching)1>,std::allocator<libdivide::divider<unsigned_int,(libdivide::Branching)1>>>>
                 (uint numerator,
                 vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
                 *dividers)

{
  bool bVar1;
  const_iterator __lhs;
  uint in_EDI;
  divider<unsigned_int,_(libdivide::Branching)1> *divider;
  const_iterator __end0;
  const_iterator __begin0;
  vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
  *__range1;
  size_t sum;
  uint32_t t;
  uint32_t q;
  uint64_t rl;
  uint64_t yl;
  uint64_t xl;
  vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<const_libdivide::divider<unsigned_int,_(libdivide::Branching)1>_*,_std::vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>_>
  local_88 [2];
  size_t local_78;
  uint local_64;
  vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
  *local_60;
  uint local_58;
  uint local_54;
  vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
  *local_50;
  uint local_44;
  vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
  *local_40;
  uint local_38;
  int local_34;
  vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
  *local_30;
  uint local_24;
  long local_20;
  ulong local_18;
  ulong local_10;
  uint local_8;
  uint local_4;
  
  local_78 = 0;
  local_64 = in_EDI;
  local_88[0]._M_current =
       (divider<unsigned_int,_(libdivide::Branching)1> *)
       std::
       vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
       ::begin(in_stack_ffffffffffffff68);
  __lhs = std::
          vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
          ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libdivide::divider<unsigned_int,_(libdivide::Branching)1>_*,_std::vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_libdivide::divider<unsigned_int,_(libdivide::Branching)1>_*,_std::vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    in_stack_ffffffffffffff68 =
         (vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
          *)__gnu_cxx::
            __normal_iterator<const_libdivide::divider<unsigned_int,_(libdivide::Branching)1>_*,_std::vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>_>
            ::operator*(local_88);
    local_58 = local_64;
    local_54 = local_64;
    local_44 = local_64;
    local_24 = local_64;
    local_8 = *(uint *)&(in_stack_ffffffffffffff68->
                        super__Vector_base<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
    local_4 = local_64;
    local_10 = (ulong)local_64;
    local_18 = (ulong)local_8;
    local_20 = local_10 * local_18;
    local_34 = (int)((ulong)local_20 >> 0x20);
    local_38 = (local_64 - local_34 >> 1) + local_34;
    local_78 = (local_38 >>
               (*(uint8_t *)
                 ((long)&(in_stack_ffffffffffffff68->
                         super__Vector_base<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 4) & 0x1f)) + local_78;
    local_60 = in_stack_ffffffffffffff68;
    local_50 = in_stack_ffffffffffffff68;
    local_40 = in_stack_ffffffffffffff68;
    local_30 = in_stack_ffffffffffffff68;
    __gnu_cxx::
    __normal_iterator<const_libdivide::divider<unsigned_int,_(libdivide::Branching)1>_*,_std::vector<libdivide::divider<unsigned_int,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_int,_(libdivide::Branching)1>_>_>_>
    ::operator++(local_88);
  }
  return local_78;
}

Assistant:

NOINLINE size_t sum_dividers(N numerator, const T& dividers) {
    size_t sum = 0;

    for (const auto& divider : dividers) sum += (size_t)(numerator / divider);

    return sum;
}